

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O0

void duckdb::SQLLogicTestLogger::PrintErrorHeader
               (string *file_name,idx_t query_line,string *description)

{
  void *this;
  ostream *poVar1;
  ulong uVar2;
  string *in_RDX;
  ulong in_RSI;
  string *in_RDI;
  
  PrintLineSep();
  this = (void *)std::ostream::operator<<(&std::cerr,termcolor::red);
  poVar1 = (ostream *)std::ostream::operator<<(this,termcolor::bold);
  poVar1 = std::operator<<(poVar1,in_RDX);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,termcolor::reset);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cerr,termcolor::bold);
    poVar1 = std::operator<<(poVar1,"(");
    poVar1 = std::operator<<(poVar1,in_RDI);
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI);
    poVar1 = std::operator<<(poVar1,")!");
    std::ostream::operator<<(poVar1,termcolor::reset);
  }
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void SQLLogicTestLogger::PrintErrorHeader(const string &file_name, idx_t query_line, const string &description) {
	PrintLineSep();
	std::cerr << termcolor::red << termcolor::bold << description << " " << termcolor::reset;
	if (!file_name.empty()) {
		std::cerr << termcolor::bold << "(" << file_name << ":" << query_line << ")!" << termcolor::reset;
	}
	std::cerr << std::endl;
}